

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

void __thiscall RenX::Server::wipePlayers(Server *this)

{
  pointer ppPVar1;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar2;
  Plugin **plugin;
  pointer ppPVar3;
  
  if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
      _M_node._M_size != 0) {
    do {
      this_00 = getCore();
      pvVar2 = Core::getPlugins(this_00);
      ppPVar1 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppPVar3 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                     _M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1;
          ppPVar3 = ppPVar3 + 1) {
        (**(code **)(*(long *)*ppPVar3 + 0xf8))
                  (*ppPVar3,this,
                   (this->players).
                   super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
                   _M_node.super__List_node_base._M_next + 1);
      }
      std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::_M_erase
                (&this->players,
                 (this->players).
                 super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
                 _M_node.super__List_node_base._M_next);
    } while ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
             _M_impl._M_node._M_size != 0);
  }
  this->m_player_rdns_resolutions_pending = 0;
  return;
}

Assistant:

void RenX::Server::wipePlayers() {
	while (this->players.size() != 0) {
		for (const auto& plugin : RenX::getCore()->getPlugins()) {
			plugin->RenX_OnPlayerDelete(*this, this->players.front());
		}
		this->players.pop_front();
	}

	m_player_rdns_resolutions_pending = 0;
}